

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_krp.c
# Opt level: O0

void beltKRPStepG(octet *key_,size_t key_len,octet *header,void *state)

{
  u32 *in_RCX;
  belt_krp_st *st;
  void *in_stack_ffffffffffffffc8;
  u32 *dest;
  u32 *h;
  
  dest = in_RCX + 10;
  h = in_RCX;
  beltH();
  u32From(dest,in_stack_ffffffffffffffc8,0x15c48c);
  u32From(dest,in_stack_ffffffffffffffc8,0x15c4a8);
  *(undefined8 *)(in_RCX + 0x12) = *(undefined8 *)in_RCX;
  *(undefined8 *)(in_RCX + 0x14) = *(undefined8 *)(in_RCX + 2);
  *(undefined8 *)(in_RCX + 0x16) = *(undefined8 *)(in_RCX + 4);
  *(undefined8 *)(in_RCX + 0x18) = *(undefined8 *)(in_RCX + 6);
  beltCompr(h,in_RCX,dest);
  u32To(dest,(size_t)in_stack_ffffffffffffffc8,(u32 *)0x15c527);
  return;
}

Assistant:

void beltKRPStepG(octet key_[], size_t key_len, const octet header[16],
	void* state)
{
	belt_krp_st* st = (belt_krp_st*)state;
	// pre
	ASSERT(memIsValid(state, beltKRP_keep()));
	ASSERT(key_len == 16 || key_len == 24 || key_len == 32);
	ASSERT(key_len <= st->len);
	ASSERT(memIsDisjoint2(key_, key_len, state, beltKRP_keep()));
	ASSERT(memIsDisjoint2(header, 16, state, beltKRP_keep()));
	// полностью определить st->block
	u32From(st->block, beltH() + 4 * (st->len - 16) + 2 * (key_len - 16), 4);
	u32From(st->block + 4, header, 16);
	// применить belt-compr2
	beltBlockCopy(st->key_new, st->key);
	beltBlockCopy(st->key_new + 4, st->key + 4);
	beltCompr(st->key_new, st->block, st->stack);
	// выгрузить ключ
	u32To(key_, key_len, st->key_new);
}